

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

int64_t msa_binsl_df(uint32_t df,int64_t dest,int64_t arg1,int64_t arg2)

{
  ulong uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = 1L << ((char)df + 3U & 0x3f);
  uVar5 = 0xffffffffffffffff >> (-(char)uVar4 & 0x3fU);
  uVar1 = arg1 & uVar5;
  uVar6 = ((uint)arg2 & (int)uVar4 - 1U) + 1;
  if (uVar4 != uVar6) {
    bVar2 = (byte)uVar6;
    bVar3 = (char)uVar4 - bVar2;
    uVar1 = ((uVar1 >> (bVar3 & 0x3f) & uVar5) << (bVar3 & 0x3f) |
            ((dest & uVar5) << (bVar2 & 0x3f) & uVar5) >> (bVar2 & 0x3f)) & uVar5;
  }
  return uVar1;
}

Assistant:

static inline int64_t msa_binsl_df(uint32_t df,
                                   int64_t dest, int64_t arg1, int64_t arg2)
{
    uint64_t u_arg1 = UNSIGNED(arg1, df);
    uint64_t u_dest = UNSIGNED(dest, df);
    int32_t sh_d = BIT_POSITION(arg2, df) + 1;
    int32_t sh_a = DF_BITS(df) - sh_d;
    if (sh_d == DF_BITS(df)) {
        return u_arg1;
    } else {
        return UNSIGNED(UNSIGNED(u_dest << sh_d, df) >> sh_d, df) |
               UNSIGNED(UNSIGNED(u_arg1 >> sh_a, df) << sh_a, df);
    }
}